

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_schema_common.c
# Opt level: O0

LY_ERR lysp_check_dup_ht_insert(lysp_ctx *ctx,ly_ht *ht,char *name,char *statement,char *err_detail)

{
  uint32_t hash_00;
  size_t len;
  ly_ctx *local_50;
  ly_ctx *local_48;
  LY_ERR local_34;
  uint32_t hash;
  LY_ERR ret;
  char *err_detail_local;
  char *statement_local;
  char *name_local;
  ly_ht *ht_local;
  lysp_ctx *ctx_local;
  
  statement_local = name;
  name_local = (char *)ht;
  ht_local = (ly_ht *)ctx;
  len = strlen(name);
  hash_00 = lyht_hash(name,len);
  local_34 = lyht_insert((ly_ht *)name_local,&statement_local,hash_00,(void **)0x0);
  if (local_34 == LY_EEXIST) {
    if (err_detail == (char *)0x0) {
      if (ht_local == (ly_ht *)0x0) {
        local_50 = (ly_ctx *)0x0;
      }
      else {
        local_50 = *(ly_ctx **)
                    **(undefined8 **)
                      (*(long *)(ht_local[1].val_equal + 8) +
                      (ulong)(*(int *)(ht_local[1].val_equal + 4) - 1) * 8);
      }
      ly_vlog(local_50,(char *)0x0,LYVE_SYNTAX_YANG,"Duplicate identifier \"%s\" of %s statement.",
              statement_local,statement);
    }
    else {
      if (ht_local == (ly_ht *)0x0) {
        local_48 = (ly_ctx *)0x0;
      }
      else {
        local_48 = *(ly_ctx **)
                    **(undefined8 **)
                      (*(long *)(ht_local[1].val_equal + 8) +
                      (ulong)(*(int *)(ht_local[1].val_equal + 4) - 1) * 8);
      }
      ly_vlog(local_48,(char *)0x0,LYVE_SYNTAX_YANG,
              "Duplicate identifier \"%s\" of %s statement - %s.",statement_local,statement,
              err_detail);
    }
    local_34 = LY_EVALID;
  }
  return local_34;
}

Assistant:

static LY_ERR
lysp_check_dup_ht_insert(struct lysp_ctx *ctx, struct ly_ht *ht, const char *name, const char *statement,
        const char *err_detail)
{
    LY_ERR ret;
    uint32_t hash;

    hash = lyht_hash(name, strlen(name));
    ret = lyht_insert(ht, &name, hash, NULL);
    if (ret == LY_EEXIST) {
        if (err_detail) {
            LOGVAL_PARSER(ctx, LY_VCODE_DUPIDENT2, name, statement, err_detail);
        } else {
            LOGVAL_PARSER(ctx, LY_VCODE_DUPIDENT, name, statement);
        }
        ret = LY_EVALID;
    }

    return ret;
}